

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

double __thiscall Model::specular(Model *this,vec2f *uvf)

{
  TGAColor TVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  TGAImage *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  this_00 = &this->specularmap_;
  dVar7 = uvf->x;
  sVar2 = TGAImage::get_width(this_00);
  auVar5._8_4_ = (int)(sVar2 >> 0x20);
  auVar5._0_8_ = sVar2;
  auVar5._12_4_ = 0x45300000;
  dVar7 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * dVar7;
  uVar3 = (ulong)dVar7;
  dVar8 = uvf->y;
  sVar2 = TGAImage::get_height(this_00);
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  dVar8 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * dVar8;
  uVar4 = (ulong)dVar8;
  TVar1 = TGAImage::get(this_00,(long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,
                        (long)(dVar8 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
  return (double)TVar1.bgra[0];
}

Assistant:

double Model::specular(const vec2f &uvf) const
{
    return specularmap_.get(static_cast<size_t>(uvf[0] * specularmap_.get_width()),
                            static_cast<size_t>(uvf[1] * specularmap_.get_height()))[0];
}